

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderLocalTime(CHud *this,float x)

{
  bool bVar1;
  int iVar2;
  CConfig *pCVar3;
  IGraphics *pIVar4;
  ITextRender *pIVar5;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  int in_stack_00000008;
  float in_stack_0000000c;
  vec4 *in_stack_00000010;
  CUIRect *in_stack_00000018;
  vec4 Color;
  CUIRect Rect;
  char aTimeStr [6];
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  CTextCursor *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  vector4_base<float> local_30;
  float local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined1 local_e [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = CComponent::Config((CComponent *)0x1699d0);
  if ((pCVar3->m_ClShowLocalTimeAlways != 0) ||
     (bVar1 = CScoreboard::IsActive(*(CScoreboard **)(*(long *)(in_RDI + 8) + 0x1b228)), bVar1)) {
    pIVar4 = CComponent::Graphics((CComponent *)0x169a01);
    (*(pIVar4->super_IInterface)._vptr_IInterface[8])();
    local_20 = in_XMM0_Da - 30.0;
    local_1c = 0;
    local_18 = 0x41c80000;
    local_14 = 0x41480000;
    vector4_base<float>::vector4_base(&local_30,0.0,0.0,0.0,0.4);
    CUIRect::Draw(in_stack_00000018,in_stack_00000010,in_stack_0000000c,in_stack_00000008);
    str_timestamp_format
              ((char *)in_stack_ffffffffffffffa0,(int)in_stack_ffffffffffffff9c,(char *)0x169a94);
    if ((RenderLocalTime(float)::s_Cursor == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderLocalTime(float)::s_Cursor), iVar2 != 0)) {
      CTextCursor::CTextCursor
                ((CTextCursor *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderLocalTime::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderLocalTime(float)::s_Cursor);
    }
    RenderLocalTime::s_Cursor.m_Align = 1;
    CTextCursor::Reset(in_stack_ffffffffffffffa0,
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    CTextCursor::MoveTo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff98);
    pIVar5 = CComponent::TextRender((CComponent *)0x169b42);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
              (pIVar5,&RenderLocalTime::s_Cursor,local_e,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderLocalTime(float x)
{
	if(!Config()->m_ClShowLocalTimeAlways && !m_pClient->m_pScoreboard->IsActive())
		return;

	//draw the box
	Graphics()->BlendNormal();
	CUIRect Rect = {x-30.0f, 0.0f, 25.0f, 12.5f};
	vec4 Color = vec4(0.0f, 0.0f, 0.0f, 0.4f);
	Rect.Draw(Color, 3.75f, CUIRect::CORNER_B);

	//draw the text
	char aTimeStr[6];
	str_timestamp_format(aTimeStr, sizeof(aTimeStr), "%H:%M");
	static CTextCursor s_Cursor(5.0f);
	s_Cursor.m_Align = TEXTALIGN_CENTER;
	s_Cursor.Reset(aTimeStr[4]); // last digit always indicate changes
	s_Cursor.MoveTo(Rect.x + Rect.w / 2, (12.5f - 7.5f) / 2.f);
	TextRender()->TextOutlined(&s_Cursor, aTimeStr, -1);
}